

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::
AdapterPromiseNode<capnp::Capability::Client,_kj::_::PromiseAndFulfillerAdapter<capnp::Capability::Client>_>
::fulfill(AdapterPromiseNode<capnp::Capability::Client,_kj::_::PromiseAndFulfillerAdapter<capnp::Capability::Client>_>
          *this,Client *value)

{
  undefined8 uVar1;
  ExceptionOr<capnp::Capability::Client> local_1b8;
  
  if (this->waiting == true) {
    this->waiting = false;
    local_1b8.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_1b8.value.ptr.isSet = true;
    local_1b8.value.ptr.field_1.value.hook.disposer = (value->hook).disposer;
    local_1b8.value.ptr.field_1.value.hook.ptr = (value->hook).ptr;
    (value->hook).ptr = (ClientHook *)0x0;
    ExceptionOr<capnp::Capability::Client>::operator=(&this->result,&local_1b8);
    uVar1 = local_1b8.value.ptr.field_1.value.hook.ptr;
    if ((local_1b8.value.ptr.isSet == true) &&
       (local_1b8.value.ptr.field_1.value.hook.ptr != (ClientHook *)0x0)) {
      local_1b8.value.ptr.field_1.value.hook.ptr = (ClientHook *)0x0;
      (**(local_1b8.value.ptr.field_1.value.hook.disposer)->_vptr_Disposer)
                (local_1b8.value.ptr.field_1.value.hook.disposer,
                 (_func_int *)
                 ((long)&((ClientHook *)uVar1)->_vptr_ClientHook +
                 (long)((ClientHook *)uVar1)->_vptr_ClientHook[-2]));
    }
    if (local_1b8.super_ExceptionOrValue.exception.ptr.isSet == true) {
      Exception::~Exception(&local_1b8.super_ExceptionOrValue.exception.ptr.field_1.value);
    }
    PromiseNode::OnReadyEvent::arm(&(this->super_AdapterPromiseNodeBase).onReadyEvent);
  }
  return;
}

Assistant:

void fulfill(T&& value) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(kj::mv(value));
      setReady();
    }
  }